

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_RevSurface::IsValid(ON_RevSurface *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  ON_Interval *pOVar5;
  double dVar6;
  double dVar7;
  double local_28;
  
  if (this->m_curve == (ON_Curve *)0x0) {
    if (text_log != (ON_TextLog *)0x0) {
      pcVar4 = "ON_RevSurface.m_curve is nullptr.\n";
LAB_0059d794:
      ON_TextLog::Print(text_log,pcVar4);
      return false;
    }
  }
  else {
    iVar2 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])();
    if ((char)iVar2 == '\0') {
      if (text_log != (ON_TextLog *)0x0) {
        pcVar4 = "ON_RevSurface.m_curve is not valid.\n";
        goto LAB_0059d794;
      }
    }
    else {
      uVar3 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (uVar3 == 3) {
        bVar1 = ON_Line::IsValid(&this->m_axis);
        if (bVar1) {
          pOVar5 = &this->m_angle;
          bVar1 = ON_Interval::IsIncreasing(pOVar5);
          if (bVar1) {
            dVar6 = ON_Interval::Length(pOVar5);
            if (dVar6 <= 6.283185307412417) {
              dVar7 = ON_Interval::Length(pOVar5);
              if (2.3283064365386963e-10 < dVar7) {
                pOVar5 = &this->m_t;
                bVar1 = ON_Interval::IsIncreasing(pOVar5);
                if (bVar1) {
                  return true;
                }
                if (text_log == (ON_TextLog *)0x0) {
                  return false;
                }
                local_28 = ON_Interval::operator[](pOVar5,0);
                dVar6 = ON_Interval::operator[](pOVar5,1);
                pcVar4 = "ON_RevSurface.m_t = (%g,%g) (should be an increasing interval)\n";
                goto LAB_0059d80c;
              }
              if (text_log == (ON_TextLog *)0x0) {
                return false;
              }
              pcVar4 = "ON_RevSurface.m_angle.Length() = %g (should be > ON_ZERO_TOLERANCE).\n";
            }
            else {
              if (text_log == (ON_TextLog *)0x0) {
                return false;
              }
              pcVar4 = "ON_RevSurface.m_angle.Length() = %g (should be <= 2*pi radians).\n";
            }
            ON_TextLog::Print(text_log,pcVar4,dVar6);
          }
          else if (text_log != (ON_TextLog *)0x0) {
            local_28 = ON_Interval::operator[](pOVar5,0);
            dVar6 = ON_Interval::operator[](pOVar5,1);
            pcVar4 = "ON_RevSurface.m_angle = (%g,%g) (should be an increasing interval)\n";
LAB_0059d80c:
            ON_TextLog::Print(text_log,pcVar4,local_28,dVar6);
            return false;
          }
        }
        else if (text_log != (ON_TextLog *)0x0) {
          pcVar4 = "ON_RevSurface.m_axis is not valid.\n";
          goto LAB_0059d794;
        }
      }
      else if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_RevSurface.m_curve->Dimension()=%d (should be 3).\n",
                          (ulong)uVar3);
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool ON_RevSurface::IsValid( ON_TextLog* text_log ) const
{
  if ( !m_curve )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_curve is nullptr.\n");
    return false;
  }
  if ( !m_curve->IsValid(text_log) )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_curve is not valid.\n");
    return false;
  }
  int dim = m_curve->Dimension();
  if ( dim != 3 )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_curve->Dimension()=%d (should be 3).\n",dim);
    return false;
  }
  if ( !m_axis.IsValid() )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_axis is not valid.\n");
    return false;
  }
  if ( !m_angle.IsIncreasing() )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_angle = (%g,%g) (should be an increasing interval)\n",
                       m_angle[0],m_angle[1]);
    return false;
  }
  double length = m_angle.Length();
  if ( length > 2.0*ON_PI + ON_ZERO_TOLERANCE )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_angle.Length() = %g (should be <= 2*pi radians).\n",length);
    return false;
  }
  if ( m_angle.Length() <= ON_ZERO_TOLERANCE )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_angle.Length() = %g (should be > ON_ZERO_TOLERANCE).\n",length);
    return false;
  }
  if ( !m_t.IsIncreasing() )
  {
    if ( text_log )
      text_log->Print( "ON_RevSurface.m_t = (%g,%g) (should be an increasing interval)\n",
                       m_t[0],m_t[1]);
    return false;
  }
  return true;
}